

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int m_get_block(aec_stream *strm)

{
  internal_state *piVar1;
  aec_stream *in_RDI;
  internal_state *state;
  int local_4;
  
  piVar1 = in_RDI->state;
  init_output(in_RDI);
  if (piVar1->block_nonzero == 0) {
    if (piVar1->blocks_avail == 0) {
      piVar1->blocks_avail = in_RDI->rsi - 1;
      piVar1->block = piVar1->data_pp;
      piVar1->blocks_dispensed = 1;
      if (in_RDI->avail_in < (ulong)piVar1->rsi_len) {
        piVar1->i = 0;
        piVar1->mode = m_get_rsi_resumable;
        local_4 = 1;
      }
      else {
        (*piVar1->get_rsi)(in_RDI);
        if ((in_RDI->flags & 8) != 0) {
          (*piVar1->preprocess)(in_RDI);
        }
        local_4 = m_check_zero_block(in_RDI);
      }
    }
    else {
      if (piVar1->ref != 0) {
        piVar1->ref = 0;
        piVar1->uncomp_len = in_RDI->block_size * in_RDI->bits_per_sample;
      }
      piVar1->block = piVar1->block + in_RDI->block_size;
      piVar1->blocks_dispensed = piVar1->blocks_dispensed + 1;
      piVar1->blocks_avail = piVar1->blocks_avail + -1;
      local_4 = m_check_zero_block(in_RDI);
    }
  }
  else {
    piVar1->block_nonzero = 0;
    piVar1->mode = m_select_code_option;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int m_get_block(struct aec_stream *strm)
{
    /**
       Provide the next block of preprocessed input data.

       Pull in a whole Reference Sample Interval (RSI) of data if
       block buffer is empty.
    */

    struct internal_state *state = strm->state;

    init_output(strm);

    if (state->block_nonzero) {
        state->block_nonzero = 0;
        state->mode = m_select_code_option;
        return M_CONTINUE;
    }

    if (state->blocks_avail == 0) {
        state->blocks_avail = strm->rsi - 1;
        state->block = state->data_pp;
        state->blocks_dispensed = 1;

        if (strm->avail_in >= state->rsi_len) {
            state->get_rsi(strm);
            if (strm->flags & AEC_DATA_PREPROCESS)
                state->preprocess(strm);

            return m_check_zero_block(strm);
        } else {
            state->i = 0;
            state->mode = m_get_rsi_resumable;
        }
    } else {
        if (state->ref) {
            state->ref = 0;
            state->uncomp_len = strm->block_size * strm->bits_per_sample;
        }
        state->block += strm->block_size;
        state->blocks_dispensed++;
        state->blocks_avail--;
        return m_check_zero_block(strm);
    }
    return M_CONTINUE;
}